

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O0

SQRESULT sqstd_writeclosuretofile(HSQUIRRELVM v,SQChar *filename)

{
  SQFILE pvVar1;
  SQRESULT SVar2;
  SQUserPointer in_RSI;
  SQWRITEFUNC in_RDI;
  SQFILE file;
  SQChar *in_stack_ffffffffffffffd8;
  SQChar *in_stack_ffffffffffffffe0;
  HSQUIRRELVM in_stack_fffffffffffffff8;
  
  pvVar1 = sqstd_fopen(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (pvVar1 == (SQFILE)0x0) {
    SVar2 = sq_throwerror((HSQUIRRELVM)0x0,in_stack_ffffffffffffffd8);
  }
  else {
    SVar2 = sq_writeclosure(in_stack_fffffffffffffff8,in_RDI,in_RSI);
    if (SVar2 < 0) {
      sqstd_fclose((SQFILE)0x1473cf);
      SVar2 = -1;
    }
    else {
      sqstd_fclose((SQFILE)0x1473ba);
      SVar2 = 0;
    }
  }
  return SVar2;
}

Assistant:

SQRESULT sqstd_writeclosuretofile(HSQUIRRELVM v,const SQChar *filename)
{
    SQFILE file = sqstd_fopen(filename,_SC("wb+"));
    if(!file) return sq_throwerror(v,_SC("cannot open the file"));
    if(SQ_SUCCEEDED(sq_writeclosure(v,file_write,file))) {
        sqstd_fclose(file);
        return SQ_OK;
    }
    sqstd_fclose(file);
    return SQ_ERROR; //forward the error
}